

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateVPTests.cpp
# Opt level: O1

void __thiscall
vkt::DynamicState::anon_unknown_4::ViewportStateBaseCase::initialize(ViewportStateBaseCase *this)

{
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  *this_00;
  RGBA local_60 [2];
  float afStack_58 [2];
  PositionColorVertex local_50;
  
  (this->super_DynamicStateBaseClass).m_topology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;
  tcu::RGBA::toVec(local_60);
  local_50.position.m_data[0] = -0.5;
  local_50.position.m_data[1] = 0.5;
  local_50.position.m_data[2] = 1.0;
  local_50.position.m_data[3] = 1.0;
  local_50.color.m_data[0] = (float)local_60[0].m_value;
  local_50.color.m_data[1] = (float)local_60[1].m_value;
  local_50.color.m_data[2] = afStack_58[0];
  local_50.color.m_data[3] = afStack_58[1];
  this_00 = &(this->super_DynamicStateBaseClass).m_data;
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,&local_50);
  tcu::RGBA::toVec(local_60);
  local_50.position.m_data[0] = 0.5;
  local_50.position.m_data[1] = 0.5;
  local_50.position.m_data[2] = 1.0;
  local_50.position.m_data[3] = 1.0;
  local_50.color.m_data[0] = (float)local_60[0].m_value;
  local_50.color.m_data[1] = (float)local_60[1].m_value;
  local_50.color.m_data[2] = afStack_58[0];
  local_50.color.m_data[3] = afStack_58[1];
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,&local_50);
  tcu::RGBA::toVec(local_60);
  local_50.position.m_data[0] = -0.5;
  local_50.position.m_data[1] = -0.5;
  local_50.position.m_data[2] = 1.0;
  local_50.position.m_data[3] = 1.0;
  local_50.color.m_data[0] = (float)local_60[0].m_value;
  local_50.color.m_data[1] = (float)local_60[1].m_value;
  local_50.color.m_data[2] = afStack_58[0];
  local_50.color.m_data[3] = afStack_58[1];
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,&local_50);
  tcu::RGBA::toVec(local_60);
  local_50.position.m_data[0] = 0.5;
  local_50.position.m_data[1] = -0.5;
  local_50.position.m_data[2] = 1.0;
  local_50.position.m_data[3] = 1.0;
  local_50.color.m_data[0] = (float)local_60[0].m_value;
  local_50.color.m_data[1] = (float)local_60[1].m_value;
  local_50.color.m_data[2] = afStack_58[0];
  local_50.color.m_data[3] = afStack_58[1];
  std::
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ::emplace_back<vkt::DynamicState::PositionColorVertex>(this_00,&local_50);
  DynamicStateBaseClass::initialize(&this->super_DynamicStateBaseClass);
  return;
}

Assistant:

void initialize(void)
	{
		m_topology = vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;

		m_data.push_back(PositionColorVertex(tcu::Vec4(-0.5f, 0.5f, 1.0f, 1.0f), tcu::RGBA::green().toVec()));
		m_data.push_back(PositionColorVertex(tcu::Vec4(0.5f, 0.5f, 1.0f, 1.0f), tcu::RGBA::green().toVec()));
		m_data.push_back(PositionColorVertex(tcu::Vec4(-0.5f, -0.5f, 1.0f, 1.0f), tcu::RGBA::green().toVec()));
		m_data.push_back(PositionColorVertex(tcu::Vec4(0.5f, -0.5f, 1.0f, 1.0f), tcu::RGBA::green().toVec()));

		DynamicStateBaseClass::initialize();
	}